

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int av1_calc_arf_boost(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,PRIMARY_RATE_CONTROL *p_rc,
                      FRAME_INFO *frame_info,int offset,int f_frames,int b_frames,
                      int *num_fpstats_used,int *num_fpstats_required,int project_gfu_boost)

{
  double dVar1;
  int iVar2;
  FIRSTPASS_STATS *pFVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double local_e8;
  double local_e0;
  GF_GROUP_STATS local_c8;
  
  local_c8.gf_group_skip_pct = 0.0;
  local_c8.gf_group_inactive_zone_rows = 0.0;
  local_c8.mv_ratio_accumulator = 0.0;
  local_c8.gf_group_err = 0.0;
  local_c8.gf_group_raw_error = 0.0;
  local_c8.decay_accumulator = 1.0;
  local_c8.zero_motion_accumulator = 1.0;
  local_c8.loop_decay_rate = 1.0;
  local_c8.last_loop_decay_rate = 1.0;
  local_c8.this_frame_mv_in_out = 0.0;
  local_c8.mv_in_out_accumulator = 0.0;
  local_c8.abs_mv_in_out_accumulator = 0.0;
  local_c8.avg_sr_coded_error = 0.0;
  local_c8.avg_pcnt_second_ref = 0.0;
  local_c8.avg_new_mv_count = 0.0;
  local_c8.avg_wavelet_energy = 0.0;
  local_c8.avg_raw_err_stdev = 0.0;
  local_c8.non_zero_stdev_count = 0;
  if (num_fpstats_used != (int *)0x0) {
    *num_fpstats_used = 0;
  }
  iVar4 = 0;
  if (0 < f_frames) {
    iVar4 = f_frames;
  }
  local_e0 = 100.0;
  iVar5 = offset;
  while ((bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6 &&
         (pFVar3 = read_frame_stats(twopass,twopass_frame,iVar5), pFVar3 != (FIRSTPASS_STATS *)0x0))
        ) {
    dVar7 = (double)frame_info->frame_height;
    accumulate_frame_motion_stats(pFVar3,&local_c8,(double)frame_info->frame_width,dVar7);
    iVar2 = detect_flash(twopass,twopass_frame,iVar5);
    if ((iVar2 == 0) &&
       (iVar2 = detect_flash(twopass,twopass_frame,iVar5 + 1), dVar8 = local_c8.decay_accumulator,
       iVar2 == 0)) {
      dVar1 = get_prediction_decay_rate(pFVar3);
      dVar1 = dVar1 * dVar8;
      dVar7 = 0.01;
      local_c8.decay_accumulator = 0.01;
      if (0.01 <= dVar1) {
        dVar7 = dVar1;
        local_c8.decay_accumulator = dVar1;
      }
    }
    dVar8 = local_c8.decay_accumulator;
    dVar7 = calc_frame_boost(p_rc,frame_info,pFVar3,local_c8.this_frame_mv_in_out,dVar7);
    if (num_fpstats_used != (int *)0x0) {
      *num_fpstats_used = *num_fpstats_used + 1;
    }
    local_e0 = local_e0 + dVar8 * dVar7;
    iVar5 = iVar5 + 1;
  }
  local_c8.gf_group_skip_pct = 0.0;
  local_c8.gf_group_inactive_zone_rows = 0.0;
  local_c8.gf_group_err = 0.0;
  local_c8.gf_group_raw_error = 0.0;
  local_c8.mv_ratio_accumulator = 0.0;
  local_c8.decay_accumulator = 1.0;
  local_c8.zero_motion_accumulator = 1.0;
  local_c8.loop_decay_rate = 1.0;
  local_c8.last_loop_decay_rate = 1.0;
  local_c8.avg_wavelet_energy = 0.0;
  local_c8.avg_raw_err_stdev = 0.0;
  local_c8.avg_pcnt_second_ref = 0.0;
  local_c8.avg_new_mv_count = 0.0;
  local_c8.abs_mv_in_out_accumulator = 0.0;
  local_c8.avg_sr_coded_error = 0.0;
  local_c8.this_frame_mv_in_out = 0.0;
  local_c8.mv_in_out_accumulator = 0.0;
  local_c8.non_zero_stdev_count = 0;
  local_e8 = 0.0;
  for (iVar4 = -1; -b_frames <= iVar4; iVar4 = iVar4 + -1) {
    iVar5 = offset + -1;
    pFVar3 = read_frame_stats(twopass,twopass_frame,iVar5);
    if (pFVar3 == (FIRSTPASS_STATS *)0x0) break;
    dVar7 = (double)frame_info->frame_height;
    accumulate_frame_motion_stats(pFVar3,&local_c8,(double)frame_info->frame_width,dVar7);
    iVar2 = detect_flash(twopass,twopass_frame,iVar5);
    if ((iVar2 == 0) &&
       (iVar2 = detect_flash(twopass,twopass_frame,offset), dVar8 = local_c8.decay_accumulator,
       iVar2 == 0)) {
      dVar1 = get_prediction_decay_rate(pFVar3);
      dVar1 = dVar1 * dVar8;
      dVar7 = 0.01;
      local_c8.decay_accumulator = 0.01;
      if (0.01 <= dVar1) {
        dVar7 = dVar1;
        local_c8.decay_accumulator = dVar1;
      }
    }
    dVar8 = local_c8.decay_accumulator;
    dVar7 = calc_frame_boost(p_rc,frame_info,pFVar3,local_c8.this_frame_mv_in_out,dVar7);
    if (num_fpstats_used != (int *)0x0) {
      *num_fpstats_used = *num_fpstats_used + 1;
    }
    local_e8 = local_e8 + dVar8 * dVar7;
    offset = iVar5;
  }
  iVar4 = (int)local_e8 + (int)local_e0;
  iVar5 = b_frames + f_frames;
  if (project_gfu_boost != 0) {
    *num_fpstats_required = iVar5;
    iVar2 = *num_fpstats_used;
    if (iVar2 < iVar5) {
      dVar7 = (double)p_rc->baseline_gf_interval;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar8 = (double)iVar5;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if (10.0 <= dVar8) {
        dVar8 = 10.0;
      }
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar1 = (double)iVar2;
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      if (10.0 <= dVar1) {
        dVar1 = 10.0;
      }
      if (dVar1 <= dVar7) {
        dVar1 = dVar7;
      }
      dVar7 = rint(((dVar8 * 10.0 + 200.0) * (double)iVar4) / (dVar1 * 10.0 + 200.0));
      iVar4 = (int)dVar7;
    }
  }
  iVar2 = iVar5 * 0x32;
  if (iVar5 * 0x32 < iVar4) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int av1_calc_arf_boost(const TWO_PASS *twopass,
                       const TWO_PASS_FRAME *twopass_frame,
                       const PRIMARY_RATE_CONTROL *p_rc, FRAME_INFO *frame_info,
                       int offset, int f_frames, int b_frames,
                       int *num_fpstats_used, int *num_fpstats_required,
                       int project_gfu_boost) {
  int i;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  double boost_score = (double)NORMAL_BOOST;
  int arf_boost;
  int flash_detected = 0;
  if (num_fpstats_used) *num_fpstats_used = 0;

  // Search forward from the proposed arf/next gf position.
  for (i = 0; i < f_frames; ++i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Accumulate the effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }

  arf_boost = (int)boost_score;

  // Reset for backward looking loop.
  boost_score = 0.0;
  init_gf_stats(&gf_stats);
  // Search backward towards last gf position.
  for (i = -1; i >= -b_frames; --i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Cumulative effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }
  arf_boost += (int)boost_score;

  if (project_gfu_boost) {
    assert(num_fpstats_required != NULL);
    assert(num_fpstats_used != NULL);
    *num_fpstats_required = f_frames + b_frames;
    arf_boost = get_projected_gfu_boost(p_rc, arf_boost, *num_fpstats_required,
                                        *num_fpstats_used);
  }

  if (arf_boost < ((b_frames + f_frames) * GF_MIN_BOOST))
    arf_boost = ((b_frames + f_frames) * GF_MIN_BOOST);

  return arf_boost;
}